

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O1

ThisType * Gs::Matrix<std::complex<float>,_4UL,_4UL>::Identity(void)

{
  undefined1 *puVar1;
  long lVar2;
  ThisType *result;
  ThisType *in_RDI;
  size_t r;
  long lVar3;
  undefined4 uVar4;
  
  in_RDI->m_[0xe]._M_value = 0;
  in_RDI->m_[0xf]._M_value = 0;
  in_RDI->m_[0xc]._M_value = 0;
  in_RDI->m_[0xd]._M_value = 0;
  in_RDI->m_[10]._M_value = 0;
  in_RDI->m_[0xb]._M_value = 0;
  in_RDI->m_[8]._M_value = 0;
  in_RDI->m_[9]._M_value = 0;
  in_RDI->m_[6]._M_value = 0;
  in_RDI->m_[7]._M_value = 0;
  in_RDI->m_[4]._M_value = 0;
  in_RDI->m_[5]._M_value = 0;
  in_RDI->m_[2]._M_value = 0;
  in_RDI->m_[3]._M_value = 0;
  in_RDI->m_[0]._M_value = 0;
  in_RDI->m_[1]._M_value = 0;
  puVar1 = (undefined1 *)((long)&in_RDI->m_[0]._M_value + 4);
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      uVar4 = 0;
      if (lVar2 == lVar3) {
        uVar4 = 0x3f800000;
      }
      *(undefined4 *)(puVar1 + lVar3 * 8 + -4) = uVar4;
      *(undefined4 *)(puVar1 + lVar3 * 8) = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + 0x20;
  } while (lVar2 != 4);
  puVar1 = (undefined1 *)((long)&in_RDI->m_[0]._M_value + 4);
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      uVar4 = 0;
      if (lVar2 == lVar3) {
        uVar4 = 0x3f800000;
      }
      *(undefined4 *)(puVar1 + lVar3 * 8 + -4) = uVar4;
      *(undefined4 *)(puVar1 + lVar3 * 8) = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + 0x20;
  } while (lVar2 != 4);
  return in_RDI;
}

Assistant:

static ThisType Identity()
        {
            ThisType result;
            result.LoadIdentity();
            return result;
        }